

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void __thiscall
ImDrawList::AddCallback(ImDrawList *this,ImDrawCallback callback,void *callback_data)

{
  uint uVar1;
  ImDrawCmd *pIVar2;
  ulong uVar3;
  long lVar4;
  ImDrawCmd *pIVar5;
  
  uVar1 = (this->CmdBuffer).Size;
  uVar3 = (ulong)uVar1;
  if (uVar3 != 0) {
    if ((int)uVar1 < 1) goto LAB_0019d2ee;
    pIVar2 = (this->CmdBuffer).Data;
    pIVar5 = pIVar2 + (uVar3 - 1);
    if (((pIVar5 != (ImDrawCmd *)0x0) && (pIVar5->ElemCount == 0)) &&
       (pIVar2[uVar3 - 1].UserCallback == (ImDrawCallback)0x0)) goto LAB_0019d2d9;
  }
  AddDrawCmd(this);
  lVar4 = (long)(this->CmdBuffer).Size;
  if (0 < lVar4) {
    pIVar5 = (this->CmdBuffer).Data + lVar4 + -1;
LAB_0019d2d9:
    pIVar5->UserCallback = callback;
    pIVar5->UserCallbackData = callback_data;
    AddDrawCmd(this);
    return;
  }
LAB_0019d2ee:
  __assert_fail("Size > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.h"
                ,0x4ca,"value_type &ImVector<ImDrawCmd>::back() [T = ImDrawCmd]");
}

Assistant:

void ImDrawList::AddCallback(ImDrawCallback callback, void* callback_data)
{
    ImDrawCmd* current_cmd = CmdBuffer.Size ? &CmdBuffer.back() : NULL;
    if (!current_cmd || current_cmd->ElemCount != 0 || current_cmd->UserCallback != NULL)
    {
        AddDrawCmd();
        current_cmd = &CmdBuffer.back();
    }
    current_cmd->UserCallback = callback;
    current_cmd->UserCallbackData = callback_data;

    AddDrawCmd(); // Force a new command after us (see comment below)
}